

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

FT_Error raccess_guess_darwin_newvfs
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  size_t __n;
  char *__dest;
  int local_3c;
  FT_Long *pFStack_38;
  FT_Error error;
  
  __n = strlen(base_file_name);
  if ((long)__n < 0x7fffffee) {
    pFStack_38 = result_offset;
    __dest = (char *)ft_mem_alloc(library->memory,__n + 0x12,&local_3c);
    if (local_3c == 0) {
      memcpy(__dest,base_file_name,__n);
      builtin_strncpy(__dest + __n,"/..namedfork/rsrc",0x12);
      *result_file_name = __dest;
      *pFStack_38 = 0;
      local_3c = 0;
    }
  }
  else {
    local_3c = 10;
  }
  return local_3c;
}

Assistant:

static FT_Error
  raccess_guess_darwin_newvfs( FT_Library  library,
                               FT_Stream   stream,
                               char       *base_file_name,
                               char      **result_file_name,
                               FT_Long    *result_offset )
  {
    /*
      Only meaningful on systems with Mac OS X (> 10.1).
     */
    FT_Error   error;
    char*      newpath = NULL;
    FT_Memory  memory;
    FT_Long    base_file_len = (FT_Long)ft_strlen( base_file_name );

    FT_UNUSED( stream );


    memory = library->memory;

    if ( base_file_len + 18 > FT_INT_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_ALLOC( newpath, base_file_len + 18 ) )
      return error;

    FT_MEM_COPY( newpath, base_file_name, base_file_len );
    FT_MEM_COPY( newpath + base_file_len, "/..namedfork/rsrc", 18 );

    *result_file_name = newpath;
    *result_offset    = 0;

    return FT_Err_Ok;
  }